

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

void __thiscall
pbrt::CurveCommon::CurveCommon
          (CurveCommon *this,span<const_pbrt::Point3<float>_> c,Float width0,Float width1,
          CurveType type,span<const_pbrt::Normal3<float>_> norm,Transform *renderFromObject,
          Transform *objectFromRender,bool reverseOrientation)

{
  undefined8 uVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  Float __x;
  float fVar5;
  undefined1 auVar8 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  Normal3<float> NVar9;
  int vb;
  size_t va;
  
  sVar4 = c.n;
  this->type = type;
  *(undefined1 (*) [32])this->cpObj = ZEXT1232(ZEXT812(0));
  *(undefined1 (*) [32])&this->cpObj[1].super_Tuple3<pbrt::Point3,_float>.y = ZEXT1232(ZEXT812(0));
  this->n[1].super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  this->n[1].super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  *(undefined1 (*) [16])this->n = ZEXT816(0) << 0x20;
  this->renderFromObject = renderFromObject;
  this->objectFromRender = objectFromRender;
  this->reverseOrientation = reverseOrientation;
  bVar2 = Transform::SwapsHandedness(renderFromObject);
  auVar8 = (undefined1  [56])0x0;
  this->transformSwapsHandedness = bVar2;
  this->width[0] = width0;
  this->width[1] = width1;
  vb = 4;
  va = sVar4;
  if (sVar4 == 4) {
    for (lVar3 = 0; lVar3 != 0x30; lVar3 = lVar3 + 0xc) {
      *(undefined4 *)((long)&this->cpObj[0].super_Tuple3<pbrt::Point3,_float>.z + lVar3) =
           *(undefined4 *)((long)&((c.ptr)->super_Tuple3<pbrt::Point3,_float>).z + lVar3);
      *(undefined8 *)((long)&this->cpObj[0].super_Tuple3<pbrt::Point3,_float>.x + lVar3) =
           *(undefined8 *)((long)&((c.ptr)->super_Tuple3<pbrt::Point3,_float>).x + lVar3);
    }
    if (norm.n == 2) {
      NVar9 = Normalize<float>(norm.ptr);
      auVar6._0_8_ = NVar9.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar6._8_56_ = auVar8;
      uVar1 = vmovlps_avx(auVar6._0_16_);
      this->n[0].super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
      this->n[0].super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
      this->n[0].super_Tuple3<pbrt::Normal3,_float>.z = NVar9.super_Tuple3<pbrt::Normal3,_float>.z;
      NVar9 = Normalize<float>(norm.ptr + 1);
      auVar7._0_8_ = NVar9.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar7._8_56_ = auVar8;
      uVar1 = vmovlps_avx(auVar7._0_16_);
      this->n[1].super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
      this->n[1].super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
      this->n[1].super_Tuple3<pbrt::Normal3,_float>.z = NVar9.super_Tuple3<pbrt::Normal3,_float>.z;
      __x = AngleBetween<float>(this->n,this->n + 1);
      this->normalAngle = __x;
      fVar5 = sinf(__x);
      this->invSinNormalAngle = 1.0 / fVar5;
    }
    *(long *)(in_FS_OFFSET + -0x3e0) = *(long *)(in_FS_OFFSET + -0x3e0) + 1;
    return;
  }
  LogFatal<char_const(&)[9],char_const(&)[2],char_const(&)[9],unsigned_long&,char_const(&)[2],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.cpp"
             ,0x1ce,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])0x3d634b,
             (char (*) [2])0x3e1e13,(char (*) [9])0x3d634b,&va,(char (*) [2])0x3e1e13,&vb);
}

Assistant:

CurveCommon::CurveCommon(pstd::span<const Point3f> c, Float width0, Float width1,
                         CurveType type, pstd::span<const Normal3f> norm,
                         const Transform *renderFromObject,
                         const Transform *objectFromRender, bool reverseOrientation)
    : type(type),
      renderFromObject(renderFromObject),
      objectFromRender(objectFromRender),
      reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject->SwapsHandedness()) {
    width[0] = width0;
    width[1] = width1;
    CHECK_EQ(c.size(), 4);
    for (int i = 0; i < 4; ++i)
        cpObj[i] = c[i];
    if (norm.size() == 2) {
        n[0] = Normalize(norm[0]);
        n[1] = Normalize(norm[1]);
        normalAngle = AngleBetween(n[0], n[1]);
        invSinNormalAngle = 1 / std::sin(normalAngle);
    }
    ++nCurves;
}